

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RoboSimian.cpp
# Opt level: O0

void __thiscall chrono::robosimian::ContactManager::Process(ContactManager *this,RoboSimian *robot)

{
  ostream *poVar1;
  element_type *peVar2;
  shared_ptr<chrono::ChContactContainer::ReportContactCallback> local_60 [2];
  shared_ptr<chrono::ChContactContainer> local_40;
  undefined1 local_28 [8];
  shared_ptr<chrono::robosimian::ContactManager> shared_this;
  RoboSimian *robot_local;
  ContactManager *this_local;
  
  shared_this.super___shared_ptr<chrono::robosimian::ContactManager,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)robot;
  poVar1 = std::operator<<((ostream *)&std::cout,"Report contacts");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  this->m_num_contacts = 0;
  std::shared_ptr<chrono::robosimian::ContactManager>::
  shared_ptr<chrono::robosimian::ContactManager,chrono::robosimian::ContactManager::Process(chrono::robosimian::RoboSimian*)::__0,void>
            ((shared_ptr<chrono::robosimian::ContactManager> *)local_28);
  RoboSimian::GetSystem
            ((RoboSimian *)
             shared_this.
             super___shared_ptr<chrono::robosimian::ContactManager,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi);
  ChSystem::GetContactContainer((ChSystem *)&local_40);
  peVar2 = std::
           __shared_ptr_access<chrono::ChContactContainer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::ChContactContainer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&local_40);
  std::shared_ptr<chrono::ChContactContainer::ReportContactCallback>::
  shared_ptr<chrono::robosimian::ContactManager,void>
            (local_60,(shared_ptr<chrono::robosimian::ContactManager> *)local_28);
  (**(code **)(*(long *)peVar2 + 0x220))(peVar2,local_60);
  std::shared_ptr<chrono::ChContactContainer::ReportContactCallback>::~shared_ptr(local_60);
  std::shared_ptr<chrono::ChContactContainer>::~shared_ptr(&local_40);
  poVar1 = std::operator<<((ostream *)&std::cout,"  total actual contacts: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_num_contacts);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::shared_ptr<chrono::robosimian::ContactManager>::~shared_ptr
            ((shared_ptr<chrono::robosimian::ContactManager> *)local_28);
  return;
}

Assistant:

void ContactManager::Process(RoboSimian* robot) {
    std::cout << "Report contacts" << std::endl;
    m_num_contacts = 0;
    std::shared_ptr<ContactManager> shared_this(this, [](ContactManager*) {});
    robot->GetSystem()->GetContactContainer()->ReportAllContacts(shared_this);
    std::cout << "  total actual contacts: " << m_num_contacts << std::endl << std::endl;
}